

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_composite_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  ID id;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  SPIRType *pSVar8;
  CompilerError *pCVar9;
  undefined8 extraout_RAX;
  Bitset *pBVar10;
  SPIREntryPoint *pSVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  _func_void *p_Var14;
  CompilerMSL *this_00;
  SPIRVariable *pSVar15;
  SPIRVariable *pSVar16;
  uint local_1d4;
  char local_1cd;
  char local_1cc;
  char local_1cb;
  char local_1ca;
  char local_1c9;
  SPIRVariable *local_1c8;
  uint32_t local_1c0;
  undefined4 local_1bc;
  SPIRType *local_1b8;
  undefined4 local_1ac;
  uint32_t local_1a8;
  uint32_t local_1a4;
  SPIRFunction *local_1a0;
  undefined1 local_198 [32];
  string local_178 [24];
  ulong *local_160;
  undefined1 *local_158;
  ulong local_150;
  undefined1 uStack_148;
  undefined7 uStack_147;
  long lStack_140;
  undefined5 local_138;
  undefined3 uStack_133;
  uint local_130;
  undefined1 local_12c;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  long lStack_110;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_e0;
  string *local_d8;
  SPIRType *local_d0;
  InterfaceBlockMeta *local_c8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_c0;
  SmallVector<std::function<void_()>,_0UL> *local_b8;
  string flatten_from_ib_mbr_name;
  string mbr_name;
  string local_70;
  string local_50;
  
  pSVar15 = var;
  local_d8 = ib_var_ref;
  local_1a0 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_c8 = meta;
  if (meta->strip_array == true) {
    pSVar8 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar8 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar3 = Compiler::is_matrix((Compiler *)this,pSVar8);
  bVar4 = Compiler::is_array((Compiler *)this,pSVar8);
  if (bVar3) {
    if (bVar4) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_198,
                 "MSL cannot emit arrays-of-matrices in input and output variables.",
                 (allocator *)&flatten_from_ib_mbr_name);
      CompilerError::CompilerError(pCVar9,(string *)local_198);
      __cxa_throw(pCVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1a8 = pSVar8->columns;
  }
  else {
    local_1a8 = 0;
    if (bVar4) {
      if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_198,
                   "MSL cannot emit arrays-of-arrays in input and output variables.",
                   (allocator *)&flatten_from_ib_mbr_name);
        CompilerError::CompilerError(pCVar9,(string *)local_198);
        __cxa_throw(pCVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1a8 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar8);
    }
  }
  bVar3 = Compiler::is_builtin_variable((Compiler *)this,var);
  local_1c0 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  local_1c9 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  local_1ca = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNoPerspective)
  ;
  local_1cb = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationCentroid);
  local_1cc = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  if (pSVar8->pointer != true) goto LAB_002929fe;
  do {
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar8->parent_type).id);
LAB_002929fe:
    bVar4 = Compiler::is_array((Compiler *)this,pSVar8);
  } while ((bVar4) || (bVar4 = Compiler::is_matrix((Compiler *)this,pSVar8), bVar4));
  local_1c8 = var;
  if (bVar3) {
    id.id = (var->super_IVariant).self.id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              ((string *)local_198,this,(ulong)local_1c0,7);
    Compiler::set_name((Compiler *)this,id,(string *)local_198);
    ::std::__cxx11::string::~string((string *)local_198);
  }
  pSVar16 = local_1c8;
  flatten_from_ib_mbr_name._M_dataplus._M_p = (pointer)&flatten_from_ib_mbr_name.field_2;
  flatten_from_ib_mbr_name._M_string_length = 0;
  flatten_from_ib_mbr_name.field_2._M_local_buf[0] = '\0';
  local_1cd = local_1c0 == 3 && bVar3;
  local_1b8 = pSVar8;
  if ((local_1c0 == 3 && bVar3) && storage == StorageClassOutput) {
    uVar6 = (uint32_t)
            (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uVar5 = Compiler::get_variable_data_type_id((Compiler *)this,local_1c8);
    local_198._0_4_ = uVar5;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              (&ib_type->member_types,(TypedID<(spirv_cross::Types)1> *)local_198);
    pSVar15 = (SPIRVariable *)0x3;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,DecorationBuiltIn,3)
    ;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_198,this,3);
    ::std::__cxx11::string::operator=((string *)&flatten_from_ib_mbr_name,(string *)local_198);
    ::std::__cxx11::string::~string((string *)local_198);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,
               &flatten_from_ib_mbr_name);
    local_1ac = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    pSVar8 = local_1b8;
    pSVar16 = local_1c8;
    if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_00292b3e;
  }
  else {
    if (local_c8->strip_array == false) {
      SPIRFunction::add_local_variable(local_1a0,(VariableID)(local_1c8->super_IVariant).self.id);
      local_198._0_4_ = (pSVar16->super_IVariant).self.id;
      SmallVector<unsigned_int,_8UL>::push_back
                (&this->vars_needing_early_declaration,(uint *)local_198);
    }
    local_1ac = 0;
  }
  local_c0 = &ib_type->member_types;
  local_e0 = &(this->inputs_by_builtin)._M_h;
  local_b8 = &local_1a0->fixup_hooks_out;
  local_1a0 = (SPIRFunction *)&local_1a0->fixup_hooks_in;
  local_d0 = ib_type;
  for (local_1d4 = 0; local_1d4 < local_1a8; local_1d4 = local_1d4 + 1) {
    uVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    local_1a4 = (pSVar8->super_IVariant).self.id;
    pBVar10 = Compiler::get_decoration_bitset
                        ((Compiler *)this,(ID)(pSVar16->super_IVariant).self.id);
    if (((pBVar10->lower & 0x40000000) == 0) ||
       ((this->msl_options).pad_fragment_output_components != true)) {
      local_1bc = 0;
    }
    else {
      pSVar11 = Compiler::get_entry_point((Compiler *)this);
      local_1bc = 0;
      if ((storage == StorageClassOutput) && (pSVar11->model == ExecutionModelFragment)) {
        uVar6 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(pSVar16->super_IVariant).self.id,DecorationLocation
                          );
        uVar6 = get_target_components_for_fragment_location(this,uVar6 + local_1d4);
        uVar1 = local_1b8->vecsize;
        pSVar8 = local_1b8;
        if (uVar1 < uVar6) {
          local_1a4 = build_extended_vector_type
                                (this,(local_1b8->super_IVariant).self.id,uVar6,Unknown);
          pSVar8 = (SPIRType *)(ulong)local_1a4;
        }
        local_1bc = (undefined4)CONCAT71((int7)((ulong)pSVar8 >> 8),uVar1 < uVar6);
        ib_type = local_d0;
        pSVar16 = local_1c8;
      }
    }
    uVar6 = Compiler::get_pointee_type_id((Compiler *)this,local_1a4);
    local_198._0_4_ = uVar6;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              (local_c0,(TypedID<(spirv_cross::Types)1> *)local_198);
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)local_198,&this->super_CompilerGLSL,(pSVar16->super_IVariant).self.id,true)
    ;
    join<std::__cxx11::string,char_const(&)[2],unsigned_int&>
              (&local_70,(spirv_cross *)local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ed65,
               (char (*) [2])&local_1d4,(uint *)pSVar15);
    this_00 = (CompilerMSL *)0x31c63e;
    ::std::__cxx11::string::string((string *)&local_50,"m",(allocator *)local_108._M_pod_data);
    ensure_valid_name(&mbr_name,this_00,&local_70,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)local_198);
    uVar6 = (uint32_t)uVar2;
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,&mbr_name);
    pBVar10 = Compiler::get_decoration_bitset
                        ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id);
    if ((pBVar10->lower & 0x40000000) == 0) {
      if (bVar3) {
        bVar4 = Compiler::is_tessellation_shader((Compiler *)this);
        if (bVar4) {
          local_198._0_4_ = local_1c0;
          sVar12 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(local_e0,(key_type *)local_198);
          if (sVar12 != 0) {
            local_198._0_4_ = local_1c0;
            pmVar13 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_e0,(key_type *)local_198);
            uVar5 = local_1d4 + pmVar13->location;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,
                       DecorationLocation,uVar5);
            mark_location_as_used_by_shader(this,uVar5,local_1b8,storage);
            goto LAB_00292ed6;
          }
        }
      }
      if (local_1cd != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,
                   DecorationBuiltIn,3);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,
                   DecorationLocation,local_1d4);
      }
    }
    else {
      uVar5 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id,DecorationLocation
                        );
      pSVar15 = local_1c8;
      uVar5 = uVar5 + local_1d4;
      if (storage == StorageClassInput) {
        uVar7 = ensure_correct_input_type
                          (this,*(uint32_t *)&(local_1c8->super_IVariant).field_0xc,uVar5,0);
        *(uint32_t *)&(pSVar15->super_IVariant).field_0xc = uVar7;
        uVar7 = ensure_correct_input_type(this,(local_1b8->super_IVariant).self.id,uVar5,0);
        (local_c0->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
        [uVar2 & 0xffffffff].id = uVar7;
        ib_type = local_d0;
      }
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,DecorationLocation
                 ,uVar5);
      mark_location_as_used_by_shader(this,uVar5,local_1b8,storage);
    }
LAB_00292ed6:
    pBVar10 = Compiler::get_decoration_bitset
                        ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id);
    if ((pBVar10->lower & 0x100000000) != 0) {
      uVar5 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(local_1c8->super_IVariant).self.id,DecorationIndex);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,DecorationIndex,
                 uVar5);
    }
    if (local_1c9 != '\0') {
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,DecorationFlat,0);
    }
    if (local_1ca != '\0') {
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,
                 DecorationNoPerspective,0);
    }
    if (local_1cb != '\0') {
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,DecorationCentroid
                 ,0);
    }
    if (local_1cc != '\0') {
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar6,DecorationSample,0
                );
    }
    uVar1 = (local_1c8->super_IVariant).self.id;
    pSVar15 = (SPIRVariable *)(ulong)uVar1;
    Compiler::set_extended_member_decoration
              ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar6,
               SPIRVCrossDecorationInterfaceOrigID,uVar1);
    pSVar16 = local_1c8;
    if (local_c8->strip_array == false) {
      if (storage == StorageClassOutput) {
        local_198._0_8_ = local_1c8;
        local_198[8] = (char)local_1bc;
        local_198._24_4_ = local_1a4;
        local_198._16_8_ = this;
        ::std::__cxx11::string::string(local_178,(string *)local_d8);
        ::std::__cxx11::string::string((string *)&local_158,(string *)&mbr_name);
        local_138 = SUB85(local_1b8,0);
        uStack_133 = (undefined3)((ulong)local_1b8 >> 0x28);
        local_130 = local_1d4;
        local_12c = (undefined1)local_1ac;
        ::std::__cxx11::string::string((string *)&local_128,(string *)&flatten_from_ib_mbr_name);
        local_f8 = (code *)0x0;
        pcStack_f0 = (code *)0x0;
        local_108._M_unused._M_object = (void *)0x0;
        local_108._8_8_ = 0;
        p_Var14 = (_func_void *)operator_new(0x90);
        *(ulong *)(p_Var14 + 0xc) = CONCAT44(local_198._16_4_,local_198._12_4_);
        *(ulong *)(p_Var14 + 0x14) = CONCAT44(local_198._24_4_,local_198._20_4_);
        *(undefined8 *)p_Var14 = local_198._0_8_;
        *(long *)(p_Var14 + 8) = CONCAT44(local_198._12_4_,local_198._8_4_);
        ::std::__cxx11::string::string((string *)(p_Var14 + 0x20),local_178);
        *(_func_void **)(p_Var14 + 0x40) = p_Var14 + 0x50;
        if (local_158 == &uStack_148) {
          *(long *)(p_Var14 + 0x50) = CONCAT71(uStack_147,uStack_148);
          *(long *)(p_Var14 + 0x58) = lStack_140;
        }
        else {
          *(undefined1 **)(p_Var14 + 0x40) = local_158;
          *(long *)(p_Var14 + 0x50) = CONCAT71(uStack_147,uStack_148);
        }
        *(ulong *)(p_Var14 + 0x48) = local_150;
        local_150 = 0;
        uStack_148 = 0;
        *(ulong *)(p_Var14 + 0x65) = CONCAT17(local_12c,CONCAT43(local_130,uStack_133));
        *(long *)(p_Var14 + 0x60) = CONCAT35(uStack_133,local_138);
        *(_func_void **)(p_Var14 + 0x70) = p_Var14 + 0x80;
        if (local_128 == &local_118) {
          *(long *)(p_Var14 + 0x80) = CONCAT71(uStack_117,local_118);
          *(long *)(p_Var14 + 0x88) = lStack_110;
        }
        else {
          *(undefined1 **)(p_Var14 + 0x70) = local_128;
          *(long *)(p_Var14 + 0x80) = CONCAT71(uStack_117,local_118);
        }
        *(long *)(p_Var14 + 0x78) = local_120;
        local_120 = 0;
        local_118 = 0;
        pcStack_f0 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2045:42)>
                     ::_M_invoke;
        local_f8 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2045:42)>
                   ::_M_manager;
        local_158 = &uStack_148;
        local_128 = &local_118;
        local_108._M_unused._0_8_ = (undefined8)p_Var14;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (local_b8,(function<void_()> *)&local_108);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_108);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_1::~__1((__1 *)local_198);
      }
      else if (storage == StorageClassInput) {
        local_198._0_8_ = local_1c8;
        local_198._16_4_ = local_1d4;
        local_198._8_8_ = this;
        ::std::__cxx11::string::string((string *)(local_198 + 0x18),(string *)local_d8);
        ::std::__cxx11::string::string((string *)&local_160,(string *)&mbr_name);
        local_f8 = (code *)0x0;
        pcStack_f0 = (code *)0x0;
        local_108._M_unused._M_object = (void *)0x0;
        local_108._8_8_ = 0;
        p_Var14 = (_func_void *)operator_new(0x58);
        *(undefined4 *)(p_Var14 + 0x10) = local_198._16_4_;
        *(undefined8 *)p_Var14 = local_198._0_8_;
        *(undefined8 *)(p_Var14 + 8) = local_198._8_8_;
        ::std::__cxx11::string::string((string *)(p_Var14 + 0x18),(string *)(local_198 + 0x18));
        *(_func_void **)(p_Var14 + 0x38) = p_Var14 + 0x48;
        if (local_160 == &local_150) {
          *(ulong *)(p_Var14 + 0x48) = local_150;
          *(long *)(p_Var14 + 0x50) = CONCAT71(uStack_147,uStack_148);
        }
        else {
          *(ulong **)(p_Var14 + 0x38) = local_160;
          *(ulong *)(p_Var14 + 0x48) = local_150;
        }
        *(undefined1 **)(p_Var14 + 0x40) = local_158;
        local_158 = (undefined1 *)0x0;
        local_150 = local_150 & 0xffffffffffffff00;
        pcStack_f0 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2041:9)>
                     ::_M_invoke;
        local_f8 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2041:9)>
                   ::_M_manager;
        local_160 = &local_150;
        local_108._M_unused._0_8_ = (undefined8)p_Var14;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)local_1a0,
                   (function<void_()> *)&local_108);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_108);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_0::~__0((__0 *)local_198);
        pSVar16 = local_1c8;
      }
    }
    ::std::__cxx11::string::~string((string *)&mbr_name);
    pSVar8 = local_1b8;
  }
LAB_00292b3e:
  ::std::__cxx11::string::~string((string *)&flatten_from_ib_mbr_name);
  return;
}

Assistant:

void CompilerMSL::add_composite_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                            SPIRType &ib_type, SPIRVariable &var,
                                                            InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t elem_cnt = 0;

	if (is_matrix(var_type))
	{
		if (is_array(var_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		elem_cnt = var_type.columns;
	}
	else if (is_array(var_type))
	{
		if (var_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		elem_cnt = to_array_size_literal(var_type);
	}

	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	auto *usable_type = &var_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	// If a builtin, force it to have the proper name.
	if (is_builtin)
		set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(get_variable_data_type_id(var));
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}
	else if (!meta.strip_array)
	{
		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		entry_func.add_local_variable(var.self);
		// We need to declare the variable early and at entry-point scope.
		vars_needing_early_declaration.push_back(var.self);
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t target_components = 0;
		bool padded_output = false;
		uint32_t type_id = usable_type->self;

		// Check if we need to pad fragment output to match a certain number of components.
		if (get_decoration_bitset(var.self).get(DecorationLocation) && msl_options.pad_fragment_output_components &&
		    get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			target_components = get_target_components_for_fragment_location(locn);
			if (usable_type->vecsize < target_components)
			{
				// Make a new type here.
				type_id = build_extended_vector_type(usable_type->self, target_components);
				padded_output = true;
			}
		}

		ib_type.member_types.push_back(get_pointee_type_id(type_id));

		// Give the member a name
		string mbr_name = ensure_valid_name(join(to_expression(var.self), "_", i), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// There is no qualified alias since we need to flatten the internal array on return.
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			if (storage == StorageClassInput)
			{
				var.basetype = ensure_correct_input_type(var.basetype, locn);
				uint32_t mbr_type_id = ensure_correct_input_type(usable_type->self, locn);
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
			}
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && is_tessellation_shader() && inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && builtin == BuiltInClipDistance)
		{
			// Declare the ClipDistance as [[user(clipN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, i);
		}

		if (get_decoration_bitset(var.self).get(DecorationIndex))
		{
			uint32_t index = get_decoration(var.self, DecorationIndex);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
		}

		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);

		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		if (!meta.strip_array)
		{
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back(
				    [=, &var]() { statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, ";"); });
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=, &var]() {
					if (padded_output)
					{
						auto &padded_type = this->get<SPIRType>(type_id);
						statement(
						    ib_var_ref, ".", mbr_name, " = ",
						    remap_swizzle(padded_type, usable_type->vecsize, join(to_name(var.self), "[", i, "]")),
						    ";");
					}
					else if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i,
						          "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", to_name(var.self), "[", i, "];");
				});
				break;

			default:
				break;
			}
		}
	}
}